

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int walIndexReadHdr(Wal *pWal,int *pChanged)

{
  u32 uVar1;
  u32 *puVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  u8 *aFrame;
  sqlite3_io_methods *psVar8;
  long lVar9;
  sqlite3_int64 sVar10;
  sqlite3_file *psVar11;
  uint uVar12;
  int iVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  u32 *page0;
  i64 nSize;
  u32 pgno;
  u8 aBuf [32];
  u32 local_b8;
  u32 *local_a8;
  ulong local_a0;
  long local_98;
  ulong local_90;
  long local_88;
  u32 local_80;
  u32 local_7c;
  undefined4 local_78;
  uint local_74;
  undefined4 local_70;
  uint local_6c;
  undefined8 local_68;
  uint local_60;
  uint local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  u8 *local_40;
  ulong local_38;
  
  if (pWal->nWiData < 1) {
LAB_00136303:
    iVar4 = walIndexPageRealloc(pWal,0,&local_a8);
    if (iVar4 != 0) {
      if (iVar4 != 0x508) {
        return iVar4;
      }
      pWal->bShmUnreliable = '\x01';
      pWal->exclusiveMode = '\x02';
      *pChanged = 1;
    }
    if (local_a8 != (u32 *)0x0) goto LAB_0013633d;
LAB_00136350:
    if ((pWal->bShmUnreliable == '\0') && ((pWal->readOnly & 2) != 0)) {
      iVar5 = 0x108;
      iVar4 = iVar5;
      if (((pWal->exclusiveMode == '\0') &&
          (iVar4 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,6), iVar4 == 0)) &&
         (iVar4 = iVar5, pWal->exclusiveMode == '\0')) {
        (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,5);
      }
    }
    else if ((pWal->exclusiveMode != '\0') ||
            (iVar4 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,10), iVar4 == 0)) {
      pWal->writeLock = '\x01';
      if (((pWal->nWiData < 1) || (local_a8 = *pWal->apWiData, local_a8 == (u32 *)0x0)) &&
         (iVar4 = walIndexPageRealloc(pWal,0,&local_a8), iVar4 != 0)) {
LAB_0013671f:
        pWal->writeLock = '\0';
        if (pWal->exclusiveMode != '\0') goto LAB_0013674f;
        bVar3 = false;
      }
      else {
        iVar4 = walIndexTryHdr(pWal,pChanged);
        if (iVar4 != 0) {
          iVar5 = 2 - (uint)pWal->ckptLock;
          iVar13 = pWal->ckptLock + 1;
          if (pWal->exclusiveMode == '\0') {
            iVar4 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar13,iVar5,10);
            if (iVar4 == 0) {
              if ((pWal->exclusiveMode != '\0') ||
                 (iVar4 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,10), iVar4 == 0))
              goto LAB_001363cc;
              if (pWal->exclusiveMode != '\0') goto LAB_00136718;
              psVar11 = pWal->pDbFd;
              psVar8 = psVar11->pMethods;
              goto LAB_00136710;
            }
          }
          else {
LAB_001363cc:
            (pWal->hdr).aSalt[0] = 0;
            (pWal->hdr).aSalt[1] = 0;
            (pWal->hdr).aCksum[0] = 0;
            (pWal->hdr).aCksum[1] = 0;
            (pWal->hdr).mxFrame = 0;
            (pWal->hdr).nPage = 0;
            (pWal->hdr).aFrameCksum[0] = 0;
            (pWal->hdr).aFrameCksum[1] = 0;
            (pWal->hdr).iVersion = 0;
            (pWal->hdr).unused = 0;
            (pWal->hdr).iChange = 0;
            (pWal->hdr).isInit = '\0';
            (pWal->hdr).bigEndCksum = '\0';
            (pWal->hdr).szPage = 0;
            iVar4 = (*pWal->pWalFd->pMethods->xFileSize)(pWal->pWalFd,&local_88);
            if (iVar4 == 0) {
              if (local_88 < 0x21) {
                uVar14 = 0;
                uVar15 = 0;
              }
              else {
                iVar4 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,&local_78,0x20,0);
                if (iVar4 != 0) goto LAB_001366df;
                uVar14 = 0;
                uVar15 = 0;
                if ((local_78._3_1_ & 0xfffffffe |
                    (local_78 >> 0x10 & 0xff) << 8 |
                    (local_78 >> 8 & 0xff) << 0x10 | local_78 << 0x18) == 0x377f0682) {
                  local_98 = (ulong)local_70._1_1_ << 0x10;
                  uVar6 = local_70 * 0x1000000 + (int)local_98;
                  local_90 = (ulong)uVar6;
                  uVar12 = (local_70 >> 0x10 & 0xff) << 8;
                  local_38 = (ulong)local_70._3_1_;
                  local_a0 = CONCAT44(local_a0._4_4_,uVar12);
                  uVar12 = uVar6 + local_70._3_1_ | uVar12;
                  if (0xffff01fe < uVar12 - 0x10001 && (uVar12 & uVar12 - 1) == 0) {
                    (pWal->hdr).bigEndCksum = (u8)(local_78._3_1_ & 1);
                    pWal->szPage = uVar12;
                    pWal->nCkpt = local_6c >> 0x18 | (local_6c & 0xff0000) >> 8 |
                                  (local_6c & 0xff00) << 8 | local_6c << 0x18;
                    *(undefined8 *)(pWal->hdr).aSalt = local_68;
                    walChecksumBytes(local_78._3_1_ & 1 ^ 1,(u8 *)&local_78,0x18,(u32 *)0x0,
                                     (pWal->hdr).aFrameCksum);
                    uVar14 = 0;
                    uVar15 = 0;
                    if (((pWal->hdr).aFrameCksum[0] ==
                         (local_60 >> 0x18 | (local_60 & 0xff0000) >> 8 | (local_60 & 0xff00) << 8 |
                         local_60 << 0x18)) &&
                       ((pWal->hdr).aFrameCksum[1] ==
                        (local_5c >> 0x18 | (local_5c & 0xff0000) >> 8 | (local_5c & 0xff00) << 8 |
                        local_5c << 0x18))) {
                      if ((local_74 >> 0x18 | (local_74 & 0xff0000) >> 8 | (local_74 & 0xff00) << 8
                          | local_74 << 0x18) == 0x2de218) {
                        iVar7 = sqlite3_initialize();
                        iVar4 = 7;
                        if (iVar7 == 0) {
                          uVar12 = uVar12 + 0x18;
                          aFrame = (u8 *)sqlite3Malloc((ulong)uVar12);
                          if (aFrame != (u8 *)0x0) {
                            local_58 = 0;
                            uStack_50 = 0;
                            if ((long)((ulong)uVar12 + 0x20) <= local_88) {
                              local_40 = aFrame + 0x18;
                              local_90 = (ulong)((uint)(local_90 >> 0x10) & 0xffff | (uint)local_a0)
                              ;
                              local_a0 = (ulong)(local_70 * 0x1000000 + (int)local_98 +
                                                 (uint)local_a0 + (int)local_38 + 0x18);
                              local_58 = 0;
                              uStack_50 = 0;
                              sVar10 = 0x20;
                              local_b8 = 1;
                              do {
                                local_98 = sVar10;
                                iVar4 = (*pWal->pWalFd->pMethods->xRead)
                                                  (pWal->pWalFd,aFrame,uVar12,sVar10);
                                if (iVar4 != 0) {
LAB_001368f5:
                                  sqlite3_free(aFrame);
                                  goto LAB_001366df;
                                }
                                iVar4 = walDecodeFrame(pWal,&local_7c,&local_80,local_40,aFrame);
                                if (iVar4 == 0) break;
                                iVar4 = walIndexAppend(pWal,local_b8,local_7c);
                                if (iVar4 != 0) goto LAB_001368f5;
                                if (local_80 != 0) {
                                  (pWal->hdr).mxFrame = local_b8;
                                  (pWal->hdr).nPage = local_80;
                                  (pWal->hdr).szPage = (u16)local_90;
                                  local_58 = *(undefined8 *)(pWal->hdr).aFrameCksum;
                                  uStack_50 = 0;
                                }
                                sVar10 = local_98 + local_a0;
                                local_b8 = local_b8 + 1;
                              } while ((long)(local_a0 + sVar10) <= local_88);
                            }
                            sqlite3_free(aFrame);
                            uVar14 = (undefined4)local_58;
                            uVar15 = local_58._4_4_;
                            goto LAB_00136675;
                          }
                        }
                      }
                      else {
                        iVar4 = 0xe;
                        sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xe893,
                                    "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50"
                                   );
                      }
                      goto LAB_001366df;
                    }
                  }
                }
              }
LAB_00136675:
              *(ulong *)(pWal->hdr).aFrameCksum = CONCAT44(uVar15,uVar14);
              walIndexWriteHdr(pWal);
              puVar2 = *pWal->apWiData;
              lVar9 = 0;
              puVar2[0x18] = 0;
              puVar2[0x20] = (pWal->hdr).mxFrame;
              puVar2[0x19] = 0;
              do {
                puVar2[lVar9 + 0x1a] = 0xffffffff;
                lVar9 = lVar9 + 1;
              } while (lVar9 != 4);
              uVar1 = (pWal->hdr).mxFrame;
              if (uVar1 != 0) {
                puVar2[0x1a] = uVar1;
              }
              if ((pWal->hdr).nPage == 0) {
                iVar4 = 0;
              }
              else {
                iVar4 = 0;
                sqlite3_log(0x11b,"recovered %d frames from WAL file %s",(ulong)(pWal->hdr).mxFrame,
                            pWal->zWalName);
              }
            }
LAB_001366df:
            if ((pWal->exclusiveMode == '\0') &&
               ((*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar13,iVar5,9),
               pWal->exclusiveMode == '\0')) {
              psVar11 = pWal->pDbFd;
              psVar8 = psVar11->pMethods;
              iVar13 = 4;
              iVar5 = 4;
LAB_00136710:
              (*psVar8->xShmLock)(psVar11,iVar13,iVar5,9);
            }
          }
LAB_00136718:
          *pChanged = 1;
          goto LAB_0013671f;
        }
        pWal->writeLock = '\0';
        iVar4 = 0;
        if (pWal->exclusiveMode != '\0') goto LAB_00136746;
        bVar3 = true;
        iVar4 = 0;
      }
      (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,9);
      if (bVar3) goto LAB_00136746;
    }
  }
  else {
    local_a8 = *pWal->apWiData;
    iVar4 = 0;
    if (local_a8 == (u32 *)0x0) goto LAB_00136303;
LAB_0013633d:
    iVar5 = walIndexTryHdr(pWal,pChanged);
    if (iVar5 != 0) goto LAB_00136350;
LAB_00136746:
    if ((pWal->hdr).iVersion != 0x2de218) {
      sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xec65,
                  "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
      if (pWal->bShmUnreliable == '\0') {
        return 0xe;
      }
      walIndexClose(pWal,0);
      pWal->bShmUnreliable = '\0';
      iVar4 = 0xe;
      goto LAB_001367c5;
    }
  }
LAB_0013674f:
  if (pWal->bShmUnreliable == '\0') {
    return iVar4;
  }
  if (iVar4 == 0) {
    iVar4 = 0;
  }
  else {
    walIndexClose(pWal,0);
    pWal->bShmUnreliable = '\0';
    if (iVar4 == 0x20a) {
      iVar4 = -1;
    }
  }
LAB_001367c5:
  pWal->exclusiveMode = '\0';
  return iVar4;
}

Assistant:

static int walIndexReadHdr(Wal *pWal, int *pChanged){
  int rc;                         /* Return code */
  int badHdr;                     /* True if a header read failed */
  volatile u32 *page0;            /* Chunk of wal-index containing header */

  /* Ensure that page 0 of the wal-index (the page that contains the 
  ** wal-index header) is mapped. Return early if an error occurs here.
  */
  assert( pChanged );
  rc = walIndexPage(pWal, 0, &page0);
  if( rc!=SQLITE_OK ){
    assert( rc!=SQLITE_READONLY ); /* READONLY changed to OK in walIndexPage */
    if( rc==SQLITE_READONLY_CANTINIT ){
      /* The SQLITE_READONLY_CANTINIT return means that the shared-memory
      ** was openable but is not writable, and this thread is unable to
      ** confirm that another write-capable connection has the shared-memory
      ** open, and hence the content of the shared-memory is unreliable,
      ** since the shared-memory might be inconsistent with the WAL file
      ** and there is no writer on hand to fix it. */
      assert( page0==0 );
      assert( pWal->writeLock==0 );
      assert( pWal->readOnly & WAL_SHM_RDONLY );
      pWal->bShmUnreliable = 1;
      pWal->exclusiveMode = WAL_HEAPMEMORY_MODE;
      *pChanged = 1;
    }else{
      return rc; /* Any other non-OK return is just an error */
    }
  }else{
    /* page0 can be NULL if the SHM is zero bytes in size and pWal->writeLock
    ** is zero, which prevents the SHM from growing */
    testcase( page0!=0 );
  }
  assert( page0!=0 || pWal->writeLock==0 );

  /* If the first page of the wal-index has been mapped, try to read the
  ** wal-index header immediately, without holding any lock. This usually
  ** works, but may fail if the wal-index header is corrupt or currently 
  ** being modified by another thread or process.
  */
  badHdr = (page0 ? walIndexTryHdr(pWal, pChanged) : 1);

  /* If the first attempt failed, it might have been due to a race
  ** with a writer.  So get a WRITE lock and try again.
  */
  assert( badHdr==0 || pWal->writeLock==0 );
  if( badHdr ){
    if( pWal->bShmUnreliable==0 && (pWal->readOnly & WAL_SHM_RDONLY) ){
      if( SQLITE_OK==(rc = walLockShared(pWal, WAL_WRITE_LOCK)) ){
        walUnlockShared(pWal, WAL_WRITE_LOCK);
        rc = SQLITE_READONLY_RECOVERY;
      }
    }else if( SQLITE_OK==(rc = walLockExclusive(pWal, WAL_WRITE_LOCK, 1)) ){
      pWal->writeLock = 1;
      if( SQLITE_OK==(rc = walIndexPage(pWal, 0, &page0)) ){
        badHdr = walIndexTryHdr(pWal, pChanged);
        if( badHdr ){
          /* If the wal-index header is still malformed even while holding
          ** a WRITE lock, it can only mean that the header is corrupted and
          ** needs to be reconstructed.  So run recovery to do exactly that.
          */
          rc = walIndexRecover(pWal);
          *pChanged = 1;
        }
      }
      pWal->writeLock = 0;
      walUnlockExclusive(pWal, WAL_WRITE_LOCK, 1);
    }
  }

  /* If the header is read successfully, check the version number to make
  ** sure the wal-index was not constructed with some future format that
  ** this version of SQLite cannot understand.
  */
  if( badHdr==0 && pWal->hdr.iVersion!=WALINDEX_MAX_VERSION ){
    rc = SQLITE_CANTOPEN_BKPT;
  }
  if( pWal->bShmUnreliable ){
    if( rc!=SQLITE_OK ){
      walIndexClose(pWal, 0);
      pWal->bShmUnreliable = 0;
      assert( pWal->nWiData>0 && pWal->apWiData[0]==0 );
      /* walIndexRecover() might have returned SHORT_READ if a concurrent
      ** writer truncated the WAL out from under it.  If that happens, it
      ** indicates that a writer has fixed the SHM file for us, so retry */
      if( rc==SQLITE_IOERR_SHORT_READ ) rc = WAL_RETRY;
    }
    pWal->exclusiveMode = WAL_NORMAL_MODE;
  }

  return rc;
}